

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void prvTidyRemoveAnchorByNode(TidyDocImpl *doc,ctmbstr name,Node *node)

{
  Anchor *pAVar1;
  int iVar2;
  uint uVar3;
  Anchor *pAVar4;
  Anchor *pAVar5;
  Anchor *a;
  
  iVar2 = prvTidyHTMLVersion(doc);
  if (iVar2 == 0x20000) {
    uVar3 = anchorNameHash5(name);
  }
  else {
    uVar3 = anchorNameHash(name);
  }
  pAVar4 = (Anchor *)((doc->attribs).anchor_hash + uVar3);
  pAVar1 = (Anchor *)0x0;
  a = pAVar4;
  do {
    pAVar5 = pAVar1;
    a = a->next;
    if (a == (Anchor *)0x0) goto LAB_001268d9;
    pAVar1 = a;
  } while (a->node != node);
  if (pAVar5 != (Anchor *)0x0) {
    pAVar4 = pAVar5;
  }
  pAVar4->next = a->next;
LAB_001268d9:
  FreeAnchor(doc,a);
  return;
}

Assistant:

void TY_(RemoveAnchorByNode)( TidyDocImpl* doc, ctmbstr name, Node *node )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Anchor *delme = NULL, *curr, *prev = NULL;
    uint h;
    if (TY_(HTMLVersion)(doc) == HT50)
        h = anchorNameHash5(name);
    else
        h = anchorNameHash(name);

    for ( curr=attribs->anchor_hash[h]; curr!=NULL; curr=curr->next )
    {
        if ( curr->node == node )
        {
            if ( prev )
                prev->next = curr->next;
            else
                attribs->anchor_hash[h] = curr->next;
            delme = curr;
            break;
        }
        prev = curr;
    }
    FreeAnchor( doc, delme );
}